

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O2

parser * visuals_file_parser_init(void)

{
  undefined8 *p;
  void *pvVar1;
  parser *p_00;
  
  p = (undefined8 *)mem_zalloc(0x50);
  if (p != (undefined8 *)0x0) {
    p[3] = 0x201;
    pvVar1 = mem_zalloc(0x1008);
    p[2] = pvVar1;
    if (pvVar1 != (void *)0x0) {
      p[7] = 8;
      pvVar1 = mem_zalloc(0x40);
      p[6] = pvVar1;
      if (pvVar1 != (void *)0x0) {
        p[9] = p[7] << 6;
        pvVar1 = mem_zalloc(p[7] << 9);
        p[8] = pvVar1;
        if (pvVar1 != (void *)0x0) {
          *p = 0;
          p[1] = 0;
          p[4] = 0;
          p[5] = 0;
          goto LAB_001e3e03;
        }
        mem_free((void *)p[6]);
      }
      mem_free((void *)p[2]);
    }
    mem_free(p);
  }
  p = (undefined8 *)0x0;
LAB_001e3e03:
  p_00 = parser_new();
  if (p_00 == (parser *)0x0 || p == (undefined8 *)0x0) {
    p_00 = (parser *)0x0;
  }
  else {
    parser_setpriv(p_00,p);
    parser_reg(p_00,"flicker sym color str name",visuals_parse_flicker);
    parser_reg(p_00,"flicker-color sym color",visuals_parse_flicker_color);
    parser_reg(p_00,"cycle sym group sym name",visuals_parse_cycle);
    parser_reg(p_00,"cycle-color sym color",visuals_parse_cycle_color);
  }
  return p_00;
}

Assistant:

static struct parser *visuals_file_parser_init(void)
{
	struct visuals_parse_context *context = visuals_parse_context_new();
	struct parser *parser = parser_new();

	if (context == NULL || parser == NULL) {
		return NULL;
	}

	parser_setpriv(parser, context);
	parser_reg(parser, "flicker sym color str name", visuals_parse_flicker);
	parser_reg(parser, "flicker-color sym color", visuals_parse_flicker_color);
	parser_reg(parser, "cycle sym group sym name", visuals_parse_cycle);
	parser_reg(parser, "cycle-color sym color", visuals_parse_cycle_color);
	return parser;
}